

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O0

void __thiscall pbrt::FormattingScene::Transform(FormattingScene *this,Float *transform,FileLoc loc)

{
  char *in_RSI;
  int i;
  int local_40;
  string local_30 [20];
  int in_stack_ffffffffffffffe4;
  FormattingScene *in_stack_ffffffffffffffe8;
  
  indent_abi_cxx11_(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4);
  Printf<std::__cxx11::string>
            (in_RSI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_ffffffffffffffe8);
  std::__cxx11::string::~string(local_30);
  for (local_40 = 0; local_40 < 0x10; local_40 = local_40 + 1) {
    Printf<float&>(in_RSI,(float *)in_stack_ffffffffffffffe8);
  }
  Printf<>(in_RSI);
  return;
}

Assistant:

void FormattingScene::Transform(Float transform[16], FileLoc loc) {
    Printf("%sTransform [ ", indent());
    for (int i = 0; i < 16; ++i)
        Printf("%f ", transform[i]);
    Printf(" ]\n");
}